

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader15.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader15::begin__vertex_weights
          (LibraryControllersLoader15 *this,vertex_weights__AttributeData *attributeData)

{
  int iVar1;
  bool bVar2;
  vertex_weights__AttributeData attrData;
  uint local_10 [2];
  uint64 local_8;
  
  bVar2 = (attributeData->present_attributes & 1) != 0;
  if (bVar2) {
    local_8 = attributeData->count;
  }
  local_10[0] = (uint)bVar2;
  iVar1 = (*(this->mLoader->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.
            super_ExtraDataLoader._vptr_ExtraDataLoader[0x21])(this->mLoader,local_10);
  return SUB41(iVar1,0);
}

Assistant:

bool LibraryControllersLoader15::begin__vertex_weights( const COLLADASaxFWL15::vertex_weights__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__vertex_weights(attributeData));
COLLADASaxFWL::vertex_weights__AttributeData attrData;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL15::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::vertex_weights__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__vertex_weights(attrData);
}